

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O1

char * ulocimp_toLegacyType_63(char *key,char *type,UBool *isKnownKey,UBool *isSpecialType)

{
  uint uVar1;
  UBool UVar2;
  int iVar3;
  void *pvVar4;
  undefined8 *puVar5;
  bool bVar6;
  
  if (isKnownKey != (UBool *)0x0) {
    *isKnownKey = '\0';
  }
  if (isSpecialType != (UBool *)0x0) {
    *isSpecialType = '\0';
  }
  iVar3 = init((EVP_PKEY_CTX *)key);
  if ((char)iVar3 == '\0') {
    return (char *)0x0;
  }
  pvVar4 = uhash_get_63(gLocExtKeyMap,key);
  if (pvVar4 == (void *)0x0) {
    return (char *)0x0;
  }
  if (isKnownKey != (UBool *)0x0) {
    *isKnownKey = '\x01';
  }
  puVar5 = (undefined8 *)uhash_get_63(*(UHashtable **)((long)pvVar4 + 0x10),type);
  if (puVar5 == (undefined8 *)0x0) {
    uVar1 = *(uint *)((long)pvVar4 + 0x18);
    if (uVar1 != 0) {
      if ((((uVar1 & 1) == 0) || (UVar2 = isSpecialTypeCodepoints(type), UVar2 == '\0')) &&
         (((uVar1 & 2) == 0 || (UVar2 = isSpecialTypeReorderCode(type), UVar2 == '\0')))) {
        bVar6 = true;
        if ((*(byte *)((long)pvVar4 + 0x18) & 4) != 0) {
          UVar2 = isSpecialTypeRgKeyValue(type);
          bVar6 = UVar2 == '\0';
        }
      }
      else {
        bVar6 = false;
      }
      if (!bVar6) {
        if (isSpecialType != (UBool *)0x0) {
          *isSpecialType = '\x01';
        }
        goto LAB_002df179;
      }
    }
    bVar6 = true;
  }
  else {
    type = (char *)*puVar5;
LAB_002df179:
    bVar6 = false;
  }
  if (bVar6) {
    return (char *)0x0;
  }
  return type;
}

Assistant:

U_CFUNC const char*
ulocimp_toLegacyType(const char* key, const char* type, UBool* isKnownKey, UBool* isSpecialType) {
    if (isKnownKey != NULL) {
        *isKnownKey = FALSE;
    }
    if (isSpecialType != NULL) {
        *isSpecialType = FALSE;
    }

    if (!init()) {
        return NULL;
    }

    LocExtKeyData* keyData = (LocExtKeyData*)uhash_get(gLocExtKeyMap, key);
    if (keyData != NULL) {
        if (isKnownKey != NULL) {
            *isKnownKey = TRUE;
        }
        LocExtType* t = (LocExtType*)uhash_get(keyData->typeMap, type);
        if (t != NULL) {
            return t->legacyId;
        }
        if (keyData->specialTypes != SPECIALTYPE_NONE) {
            UBool matched = FALSE;
            if (keyData->specialTypes & SPECIALTYPE_CODEPOINTS) {
                matched = isSpecialTypeCodepoints(type);
            }
            if (!matched && keyData->specialTypes & SPECIALTYPE_REORDER_CODE) {
                matched = isSpecialTypeReorderCode(type);
            }
            if (!matched && keyData->specialTypes & SPECIALTYPE_RG_KEY_VALUE) {
                matched = isSpecialTypeRgKeyValue(type);
            }
            if (matched) {
                if (isSpecialType != NULL) {
                    *isSpecialType = TRUE;
                }
                return type;
            }
        }
    }
    return NULL;
}